

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_list.cpp
# Opt level: O1

void __thiscall
duckdb::GlobMultiFileList::GlobMultiFileList
          (GlobMultiFileList *this,ClientContext *context_p,
          vector<duckdb::OpenFileInfo,_true> *paths_p,FileGlobOptions options)

{
  pointer pOVar1;
  pointer pOVar2;
  pointer pOVar3;
  vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> local_38;
  
  pOVar1 = (paths_p->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
           super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pOVar2 = (paths_p->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
           super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pOVar3 = (paths_p->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
           super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (paths_p->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (paths_p->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (paths_p->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_MultiFileList)._vptr_MultiFileList = (_func_int **)&PTR__MultiFileList_019bd990;
  (this->super_MultiFileList).paths.
  super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_start = pOVar1;
  (this->super_MultiFileList).paths.
  super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = pOVar2;
  (this->super_MultiFileList).paths.
  super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pOVar3;
  local_38.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_MultiFileList).glob_options = options;
  std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector(&local_38);
  (this->super_MultiFileList)._vptr_MultiFileList = (_func_int **)&PTR__GlobMultiFileList_019bda40;
  this->context = context_p;
  this->current_path = 0;
  (this->expanded_files).super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->expanded_files).super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->expanded_files).super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  return;
}

Assistant:

GlobMultiFileList::GlobMultiFileList(ClientContext &context_p, vector<OpenFileInfo> paths_p, FileGlobOptions options)
    : MultiFileList(std::move(paths_p), options), context(context_p), current_path(0) {
}